

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void jpgd::Col<7>::idct(uint8 *pDst_ptr,int *pTemp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  
  iVar4 = (pTemp[0x30] + pTemp[0x10]) * 0x1151;
  iVar10 = pTemp[0x30] * -0x3b21 + iVar4;
  iVar4 = pTemp[0x10] * 0x187e + iVar4;
  iVar11 = pTemp[8];
  iVar2 = (pTemp[0x20] + *pTemp) * 0x2000;
  iVar3 = (*pTemp - pTemp[0x20]) * 0x2000;
  iVar6 = iVar2 + iVar4;
  iVar2 = iVar2 - iVar4;
  iVar4 = iVar3 + iVar10;
  iVar3 = iVar3 - iVar10;
  iVar10 = pTemp[0x28];
  iVar1 = pTemp[0x18];
  iVar7 = (iVar11 + iVar10 + iVar1) * 0x25a1;
  iVar14 = (iVar1 + iVar10) * -0x5203;
  iVar12 = iVar1 * -0x3ec5 + iVar7;
  iVar7 = (iVar11 + iVar10) * -0xc7c + iVar7;
  iVar5 = iVar11 * -0x1ccd + iVar12;
  iVar10 = iVar10 * 0x41b3 + iVar14 + iVar7;
  iVar12 = iVar1 * 0x6254 + iVar14 + iVar12;
  iVar7 = iVar11 * 0x133e + iVar7;
  iVar11 = iVar7 + iVar6;
  uVar8 = iVar11 + 0x2020000 >> 0x12;
  uVar13 = (uint)(byte)-(-0x2020001 < iVar11);
  if (uVar8 < 0x100) {
    uVar13 = uVar8;
  }
  iVar6 = iVar6 - iVar7;
  uVar9 = iVar6 + 0x2020000 >> 0x12;
  uVar8 = (uint)(byte)-(-0x2020001 < iVar6);
  if (uVar9 < 0x100) {
    uVar8 = uVar9;
  }
  *pDst_ptr = (uint8)uVar13;
  pDst_ptr[0x38] = (uint8)uVar8;
  iVar6 = iVar12 + iVar4;
  uVar8 = iVar6 + 0x2020000 >> 0x12;
  uVar13 = (uint)(byte)-(-0x2020001 < iVar6);
  if (uVar8 < 0x100) {
    uVar13 = uVar8;
  }
  pDst_ptr[8] = (uint8)uVar13;
  iVar4 = iVar4 - iVar12;
  uVar8 = iVar4 + 0x2020000 >> 0x12;
  uVar13 = (uint)(byte)-(-0x2020001 < iVar4);
  if (uVar8 < 0x100) {
    uVar13 = uVar8;
  }
  pDst_ptr[0x30] = (uint8)uVar13;
  iVar6 = iVar10 + iVar3;
  uVar8 = iVar6 + 0x2020000 >> 0x12;
  uVar13 = (uint)(byte)-(-0x2020001 < iVar6);
  if (uVar8 < 0x100) {
    uVar13 = uVar8;
  }
  iVar3 = iVar3 - iVar10;
  uVar9 = iVar3 + 0x2020000 >> 0x12;
  uVar8 = (uint)(byte)-(-0x2020001 < iVar3);
  if (uVar9 < 0x100) {
    uVar8 = uVar9;
  }
  pDst_ptr[0x10] = (uint8)uVar13;
  pDst_ptr[0x28] = (uint8)uVar8;
  iVar6 = iVar5 + iVar2;
  uVar8 = iVar6 + 0x2020000 >> 0x12;
  uVar13 = (uint)(byte)-(-0x2020001 < iVar6);
  if (uVar8 < 0x100) {
    uVar13 = uVar8;
  }
  pDst_ptr[0x18] = (uint8)uVar13;
  iVar2 = iVar2 - iVar5;
  uVar8 = iVar2 + 0x2020000 >> 0x12;
  uVar13 = (uint)(byte)-(-0x2020001 < iVar2);
  if (uVar8 < 0x100) {
    uVar13 = uVar8;
  }
  pDst_ptr[0x20] = (uint8)uVar13;
  return;
}

Assistant:

static void idct(uint8* pDst_ptr, const int* pTemp)
		{
			// ACCESS_ROW() will be optimized at compile time to either an array access, or 0.
#define ACCESS_ROW(x) (((x) < NONZERO_ROWS) ? pTemp[x * 8] : 0)

			const int z2 = ACCESS_ROW(2);
			const int z3 = ACCESS_ROW(6);

			const int z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
			const int tmp2 = z1 + MULTIPLY(z3, -FIX_1_847759065);
			const int tmp3 = z1 + MULTIPLY(z2, FIX_0_765366865);

			const int tmp0 = left_shifti(ACCESS_ROW(0) + ACCESS_ROW(4), CONST_BITS);
			const int tmp1 = left_shifti(ACCESS_ROW(0) - ACCESS_ROW(4), CONST_BITS);

			const int tmp10 = tmp0 + tmp3, tmp13 = tmp0 - tmp3, tmp11 = tmp1 + tmp2, tmp12 = tmp1 - tmp2;

			const int atmp0 = ACCESS_ROW(7), atmp1 = ACCESS_ROW(5), atmp2 = ACCESS_ROW(3), atmp3 = ACCESS_ROW(1);

			const int bz1 = atmp0 + atmp3, bz2 = atmp1 + atmp2, bz3 = atmp0 + atmp2, bz4 = atmp1 + atmp3;
			const int bz5 = MULTIPLY(bz3 + bz4, FIX_1_175875602);

			const int az1 = MULTIPLY(bz1, -FIX_0_899976223);
			const int az2 = MULTIPLY(bz2, -FIX_2_562915447);
			const int az3 = MULTIPLY(bz3, -FIX_1_961570560) + bz5;
			const int az4 = MULTIPLY(bz4, -FIX_0_390180644) + bz5;

			const int btmp0 = MULTIPLY(atmp0, FIX_0_298631336) + az1 + az3;
			const int btmp1 = MULTIPLY(atmp1, FIX_2_053119869) + az2 + az4;
			const int btmp2 = MULTIPLY(atmp2, FIX_3_072711026) + az2 + az3;
			const int btmp3 = MULTIPLY(atmp3, FIX_1_501321110) + az1 + az4;

			int i = DESCALE_ZEROSHIFT(tmp10 + btmp3, CONST_BITS + PASS1_BITS + 3);
			pDst_ptr[8 * 0] = (uint8)CLAMP(i);

			i = DESCALE_ZEROSHIFT(tmp10 - btmp3, CONST_BITS + PASS1_BITS + 3);
			pDst_ptr[8 * 7] = (uint8)CLAMP(i);

			i = DESCALE_ZEROSHIFT(tmp11 + btmp2, CONST_BITS + PASS1_BITS + 3);
			pDst_ptr[8 * 1] = (uint8)CLAMP(i);

			i = DESCALE_ZEROSHIFT(tmp11 - btmp2, CONST_BITS + PASS1_BITS + 3);
			pDst_ptr[8 * 6] = (uint8)CLAMP(i);

			i = DESCALE_ZEROSHIFT(tmp12 + btmp1, CONST_BITS + PASS1_BITS + 3);
			pDst_ptr[8 * 2] = (uint8)CLAMP(i);

			i = DESCALE_ZEROSHIFT(tmp12 - btmp1, CONST_BITS + PASS1_BITS + 3);
			pDst_ptr[8 * 5] = (uint8)CLAMP(i);

			i = DESCALE_ZEROSHIFT(tmp13 + btmp0, CONST_BITS + PASS1_BITS + 3);
			pDst_ptr[8 * 3] = (uint8)CLAMP(i);

			i = DESCALE_ZEROSHIFT(tmp13 - btmp0, CONST_BITS + PASS1_BITS + 3);
			pDst_ptr[8 * 4] = (uint8)CLAMP(i);
		}